

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string,void>
          (Boxed_Value *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          bool t_return_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (t->_M_dataplus)._M_p;
  paVar1 = &t->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&t->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = t->_M_string_length;
  (t->_M_dataplus)._M_p = (pointer)paVar1;
  t->_M_string_length = 0;
  (t->field_2)._M_local_buf[0] = '\0';
  Object_Data::get<std::__cxx11::string>((Object_Data *)this,&local_30,t_return_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void reset_return_value() const noexcept { m_data->m_return_value = false; }